

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

size_t __thiscall google::protobuf::DescriptorProto::ByteSizeLong(DescriptorProto *this)

{
  UnknownFieldSet *unknown_fields;
  Type *pTVar1;
  size_t sVar2;
  Type *value;
  Type *value_00;
  Type *value_01;
  Type *value_02;
  Type *value_03;
  Type *value_04;
  size_t sVar3;
  uint i_1;
  uint uVar4;
  uint index;
  long lVar5;
  uint i;
  uint uVar6;
  
  uVar6 = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    sVar2 = 0;
  }
  else {
    unknown_fields = DescriptorProto::unknown_fields(this);
    sVar2 = internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
  }
  uVar4 = (this->field_).super_RepeatedPtrFieldBase.current_size_;
  lVar5 = sVar2 + uVar4;
  for (; uVar4 != uVar6; uVar6 = uVar6 + 1) {
    pTVar1 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                       (&(this->field_).super_RepeatedPtrFieldBase,uVar6);
    sVar2 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::FieldDescriptorProto>
                      (pTVar1);
    lVar5 = lVar5 + sVar2;
  }
  uVar6 = (this->nested_type_).super_RepeatedPtrFieldBase.current_size_;
  lVar5 = lVar5 + (ulong)uVar6;
  for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
    value = internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                      (&(this->nested_type_).super_RepeatedPtrFieldBase,uVar4);
    sVar2 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::DescriptorProto>(value)
    ;
    lVar5 = lVar5 + sVar2;
  }
  uVar6 = (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
  lVar5 = lVar5 + (ulong)uVar6;
  for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
    value_00 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                         (&(this->enum_type_).super_RepeatedPtrFieldBase,uVar4);
    sVar2 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::EnumDescriptorProto>
                      (value_00);
    lVar5 = lVar5 + sVar2;
  }
  uVar6 = (this->extension_range_).super_RepeatedPtrFieldBase.current_size_;
  lVar5 = lVar5 + (ulong)uVar6;
  for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
    value_01 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::TypeHandler>
                         (&(this->extension_range_).super_RepeatedPtrFieldBase,uVar4);
    sVar2 = internal::WireFormatLite::
            MessageSizeNoVirtual<google::protobuf::DescriptorProto_ExtensionRange>(value_01);
    lVar5 = lVar5 + sVar2;
  }
  uVar6 = (this->extension_).super_RepeatedPtrFieldBase.current_size_;
  lVar5 = lVar5 + (ulong)uVar6;
  for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
    pTVar1 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                       (&(this->extension_).super_RepeatedPtrFieldBase,uVar4);
    sVar2 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::FieldDescriptorProto>
                      (pTVar1);
    lVar5 = lVar5 + sVar2;
  }
  uVar6 = (this->oneof_decl_).super_RepeatedPtrFieldBase.current_size_;
  lVar5 = lVar5 + (ulong)uVar6;
  for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
    value_02 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::OneofDescriptorProto>::TypeHandler>
                         (&(this->oneof_decl_).super_RepeatedPtrFieldBase,uVar4);
    sVar2 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::OneofDescriptorProto>
                      (value_02);
    lVar5 = lVar5 + sVar2;
  }
  uVar6 = (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
  lVar5 = lVar5 + (ulong)uVar6;
  for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
    value_03 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange>::TypeHandler>
                         (&(this->reserved_range_).super_RepeatedPtrFieldBase,uVar4);
    sVar2 = internal::WireFormatLite::
            MessageSizeNoVirtual<google::protobuf::DescriptorProto_ReservedRange>(value_03);
    lVar5 = lVar5 + sVar2;
  }
  uVar6 = (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_;
  sVar2 = lVar5 + (ulong)uVar6;
  index = 0;
  uVar4 = 0;
  if (0 < (int)uVar6) {
    uVar4 = uVar6;
  }
  for (; uVar4 != index; index = index + 1) {
    value_04 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&(this->reserved_name_).super_RepeatedPtrFieldBase,index);
    sVar3 = internal::WireFormatLite::StringSize(value_04);
    sVar2 = sVar2 + sVar3;
  }
  uVar6 = (this->_has_bits_).has_bits_[0];
  if ((uVar6 & 3) != 0) {
    if ((uVar6 & 1) != 0) {
      sVar3 = internal::WireFormatLite::StringSize((this->name_).ptr_);
      sVar2 = sVar2 + sVar3 + 1;
      uVar6 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar6 & 2) != 0) {
      sVar3 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::MessageOptions>
                        (this->options_);
      sVar2 = sVar2 + sVar3 + 1;
    }
  }
  this->_cached_size_ = (int)sVar2;
  return sVar2;
}

Assistant:

size_t DescriptorProto::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.DescriptorProto)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  // repeated .google.protobuf.FieldDescriptorProto field = 2;
  {
    unsigned int count = this->field_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->field(i));
    }
  }

  // repeated .google.protobuf.DescriptorProto nested_type = 3;
  {
    unsigned int count = this->nested_type_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->nested_type(i));
    }
  }

  // repeated .google.protobuf.EnumDescriptorProto enum_type = 4;
  {
    unsigned int count = this->enum_type_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->enum_type(i));
    }
  }

  // repeated .google.protobuf.DescriptorProto.ExtensionRange extension_range = 5;
  {
    unsigned int count = this->extension_range_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->extension_range(i));
    }
  }

  // repeated .google.protobuf.FieldDescriptorProto extension = 6;
  {
    unsigned int count = this->extension_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->extension(i));
    }
  }

  // repeated .google.protobuf.OneofDescriptorProto oneof_decl = 8;
  {
    unsigned int count = this->oneof_decl_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->oneof_decl(i));
    }
  }

  // repeated .google.protobuf.DescriptorProto.ReservedRange reserved_range = 9;
  {
    unsigned int count = this->reserved_range_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->reserved_range(i));
    }
  }

  // repeated string reserved_name = 10;
  total_size += 1 *
      ::google::protobuf::internal::FromIntSize(this->reserved_name_size());
  for (int i = 0, n = this->reserved_name_size(); i < n; i++) {
    total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
      this->reserved_name(i));
  }

  if (_has_bits_[0 / 32] & 3u) {
    // optional string name = 1;
    if (has_name()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->name());
    }

    // optional .google.protobuf.MessageOptions options = 7;
    if (has_options()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *this->options_);
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}